

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void adjust_assign(LexState *ls,int nvars,int nexps,expdesc *e)

{
  int iVar1;
  int *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int reg;
  int extra;
  FuncState *fs;
  undefined4 in_stack_ffffffffffffffd8;
  FuncState *fs_00;
  
  fs_00 = *(FuncState **)(in_RDI + 0x30);
  iVar1 = in_ESI - in_EDX;
  if ((*in_RCX == 0xd) || (*in_RCX == 0xe)) {
    iVar1 = iVar1 + 1;
    if (iVar1 < 0) {
      iVar1 = 0;
    }
    luaK_setreturns(fs_00,(expdesc *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),0);
    if (1 < iVar1) {
      luaK_reserveregs(fs_00,iVar1);
    }
  }
  else {
    if (*in_RCX != 0) {
      luaK_exp2nextreg(fs_00,(expdesc *)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
    }
    if (0 < iVar1) {
      luaK_reserveregs(fs_00,iVar1);
      luaK_nil((FuncState *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RCX >> 0x20),(int)in_RCX);
    }
  }
  return;
}

Assistant:

static void adjust_assign(LexState*ls,int nvars,int nexps,expdesc*e){
FuncState*fs=ls->fs;
int extra=nvars-nexps;
if(hasmultret(e->k)){
extra++;
if(extra<0)extra=0;
luaK_setreturns(fs,e,extra);
if(extra>1)luaK_reserveregs(fs,extra-1);
}
else{
if(e->k!=VVOID)luaK_exp2nextreg(fs,e);
if(extra>0){
int reg=fs->freereg;
luaK_reserveregs(fs,extra);
luaK_nil(fs,reg,extra);
}
}
}